

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffr2e(float fval,int decim,char *cval,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *in_RDX;
  char *in_RSI;
  uint in_EDI;
  float in_XMM0_Da;
  char *cptr;
  int local_4;
  
  if (*in_RDX < 1) {
    *in_RSI = '\0';
    if ((int)in_EDI < 0) {
      iVar1 = snprintf(in_RSI,0x47,"%.*G",(double)in_XMM0_Da,(ulong)-in_EDI);
      if (iVar1 < 0) {
        ffpmsg((char *)0x232d0e);
        *in_RDX = 0x192;
      }
      else {
        pcVar2 = strchr(in_RSI,0x2e);
        if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(in_RSI,0x2c), pcVar2 == (char *)0x0)) &&
           (pcVar2 = strchr(in_RSI,0x45), pcVar2 != (char *)0x0)) {
          iVar1 = snprintf(in_RSI,0x47,"%.1E",(double)in_XMM0_Da);
          if (iVar1 < 0) {
            ffpmsg((char *)0x232d98);
            *in_RDX = 0x192;
          }
          pcVar2 = strchr(in_RSI,0x2c);
          if (pcVar2 != (char *)0x0) {
            *pcVar2 = '.';
          }
          return *in_RDX;
        }
      }
    }
    else {
      iVar1 = snprintf(in_RSI,0x47,"%.*E",(double)in_XMM0_Da,(ulong)in_EDI);
      if (iVar1 < 0) {
        ffpmsg((char *)0x232e0e);
        *in_RDX = 0x192;
      }
    }
    if (*in_RDX < 1) {
      pcVar2 = strchr(in_RSI,0x2c);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '.';
      }
      pcVar2 = strchr(in_RSI,0x4e);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strchr(in_RSI,0x2e);
        if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(in_RSI,0x45), pcVar2 == (char *)0x0)) &&
           (sVar3 = strlen(in_RSI), sVar3 < 0x46)) {
          strcat(in_RSI,".");
        }
      }
      else {
        ffpmsg((char *)0x232e6a);
        *in_RDX = 0x192;
      }
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffr2e(float fval,  /* I - value to be converted to a string */
         int decim,    /* I - number of decimal places to display */
         char *cval,   /* O - character string representation of the value */
         int *status)  /* IO - error status */
/*
  convert float value to a null-terminated exponential format string
*/
{
    char *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {   /* use G format if decim is negative */
        if ( snprintf(cval, FLEN_VALUE,"%.*G", -decim, fval) < 0)
        {
            ffpmsg("Error in ffr2e converting float to string");
            *status = BAD_F2C;
        }
        else
        {
            /* test if E format was used, and there is no displayed decimal */
            /* If locale is French, decimal will be a comma. So look for that too. */
            if ( !strchr(cval, '.') && !strchr(cval, ',') && strchr(cval,'E') )
            {
                /* reformat value with a decimal point and single zero */
                if ( snprintf(cval, FLEN_VALUE,"%.1E", fval) < 0)
                {
                    ffpmsg("Error in ffr2e converting float to string");
                    *status = BAD_F2C;
                }
                /* convert French locale comma to a decimal point.*/
                if ((cptr = strchr(cval, ','))) *cptr = '.';
                return(*status);  
            }
        }
    }
    else
    {
        if ( snprintf(cval, FLEN_VALUE,"%.*E", decim, fval) < 0)
        {
            ffpmsg("Error in ffr2e converting float to string");
            *status = BAD_F2C;
        }
    }

    if (*status <= 0)
    {
        /* replace comma with a period (e.g. in French locale) */
        if ( (cptr = strchr(cval, ','))) *cptr = '.';

        /* test if output string is 'NaN', 'INDEF', or 'INF' */
        if (strchr(cval, 'N'))
        {
            ffpmsg("Error in ffr2e: float value is a NaN or INDEF");
            *status = BAD_F2C;
        }
        else if ( !strchr(cval, '.') && !strchr(cval,'E') && strlen(cval) < FLEN_VALUE-1 )
        {
            /* add decimal point if necessary to distinquish from integer */
            strcat(cval, ".");
        }
    }

    return(*status);
}